

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

bool __thiscall
google::protobuf::DescriptorPool::TryFindSymbolInFallbackDatabase(DescriptorPool *this,string *name)

{
  bool bVar1;
  uint uVar2;
  Tables *pTVar3;
  size_type sVar4;
  string *key;
  FileDescriptor *pFVar5;
  undefined1 local_f8 [8];
  FileDescriptorProto file_proto;
  string *name_local;
  DescriptorPool *this_local;
  
  if (this->fallback_database_ == (DescriptorDatabase *)0x0) {
    return false;
  }
  file_proto.source_code_info_ = (SourceCodeInfo *)name;
  pTVar3 = internal::scoped_ptr<google::protobuf::DescriptorPool::Tables>::operator->
                     (&this->tables_);
  sVar4 = std::
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count(&(pTVar3->known_bad_symbols_).
                   super_unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ,(key_type *)file_proto.source_code_info_);
  if (sVar4 != 0) {
    return false;
  }
  FileDescriptorProto::FileDescriptorProto((FileDescriptorProto *)local_f8);
  bVar1 = IsSubSymbolOfBuiltType(this,(string *)file_proto.source_code_info_);
  if ((!bVar1) &&
     (uVar2 = (*this->fallback_database_->_vptr_DescriptorDatabase[3])
                        (this->fallback_database_,file_proto.source_code_info_,local_f8),
     (uVar2 & 1) != 0)) {
    pTVar3 = internal::scoped_ptr<google::protobuf::DescriptorPool::Tables>::operator->
                       (&this->tables_);
    key = FileDescriptorProto::name_abi_cxx11_((FileDescriptorProto *)local_f8);
    pFVar5 = Tables::FindFile(pTVar3,key);
    if ((pFVar5 == (FileDescriptor *)0x0) &&
       (pFVar5 = BuildFileFromDatabase(this,(FileDescriptorProto *)local_f8),
       pFVar5 != (FileDescriptor *)0x0)) {
      this_local._7_1_ = true;
      goto LAB_004cdb0f;
    }
  }
  pTVar3 = internal::scoped_ptr<google::protobuf::DescriptorPool::Tables>::operator->
                     (&this->tables_);
  std::
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::insert(&(pTVar3->known_bad_symbols_).
            super_unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ,(value_type *)file_proto.source_code_info_);
  this_local._7_1_ = false;
LAB_004cdb0f:
  FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)local_f8);
  return this_local._7_1_;
}

Assistant:

bool DescriptorPool::TryFindSymbolInFallbackDatabase(const string& name) const {
  if (fallback_database_ == NULL) return false;

  if (tables_->known_bad_symbols_.count(name) > 0) return false;

  FileDescriptorProto file_proto;
  if (// We skip looking in the fallback database if the name is a sub-symbol
      // of any descriptor that already exists in the descriptor pool (except
      // for package descriptors).  This is valid because all symbols except
      // for packages are defined in a single file, so if the symbol exists
      // then we should already have its definition.
      //
      // The other reason to do this is to support "overriding" type
      // definitions by merging two databases that define the same type.  (Yes,
      // people do this.)  The main difficulty with making this work is that
      // FindFileContainingSymbol() is allowed to return both false positives
      // (e.g., SimpleDescriptorDatabase, UpgradedDescriptorDatabase) and false
      // negatives (e.g. ProtoFileParser, SourceTreeDescriptorDatabase).
      // When two such databases are merged, looking up a non-existent
      // sub-symbol of a type that already exists in the descriptor pool can
      // result in an attempt to load multiple definitions of the same type.
      // The check below avoids this.
      IsSubSymbolOfBuiltType(name)

      // Look up file containing this symbol in fallback database.
      || !fallback_database_->FindFileContainingSymbol(name, &file_proto)

      // Check if we've already built this file. If so, it apparently doesn't
      // contain the symbol we're looking for.  Some DescriptorDatabases
      // return false positives.
      || tables_->FindFile(file_proto.name()) != NULL

      // Build the file.
      || BuildFileFromDatabase(file_proto) == NULL) {
    tables_->known_bad_symbols_.insert(name);
    return false;
  }

  return true;
}